

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O2

bool SigHasLowR(secp256k1_ecdsa_signature *sig)

{
  long in_FS_OFFSET;
  uchar compact_sig [64];
  uchar local_58 [72];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  secp256k1_ecdsa_signature_serialize_compact(secp256k1_context_sign,local_58,sig);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return -1 < (char)local_58[0];
  }
  __stack_chk_fail();
}

Assistant:

bool SigHasLowR(const secp256k1_ecdsa_signature* sig)
{
    unsigned char compact_sig[64];
    secp256k1_ecdsa_signature_serialize_compact(secp256k1_context_sign, compact_sig, sig);

    // In DER serialization, all values are interpreted as big-endian, signed integers. The highest bit in the integer indicates
    // its signed-ness; 0 is positive, 1 is negative. When the value is interpreted as a negative integer, it must be converted
    // to a positive value by prepending a 0x00 byte so that the highest bit is 0. We can avoid this prepending by ensuring that
    // our highest bit is always 0, and thus we must check that the first byte is less than 0x80.
    return compact_sig[0] < 0x80;
}